

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O0

void __thiscall
phmap::priv::
parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
::iterator::skip_empty(iterator *this)

{
  bool bVar1;
  iterator iVar2;
  ctrl_t *local_30;
  anon_union_8_1_a8a14541_for_iterator_1 local_28;
  ctrl_t *local_20;
  anon_union_8_1_a8a14541_for_iterator_1 local_18;
  iterator *this_local;
  
  while( true ) {
    bVar1 = priv::operator==(&this->it_,&this->it_end_);
    if (!bVar1) {
      return;
    }
    this->inner_ = this->inner_ + 1;
    if (this->inner_ == this->inner_end_) break;
    iVar2 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
            ::begin(&this->inner_->set_);
    local_20 = iVar2.ctrl_;
    (this->it_).ctrl_ = local_20;
    local_18 = iVar2.field_1;
    (this->it_).field_1 = local_18;
    iVar2 = raw_hash_set<phmap::priv::NodeHashMapPolicy<phmap::priv::NonStandardLayout,_int>,_phmap::priv::StatefulTestingHash,_phmap::priv::StatefulTestingEqual,_phmap::priv::Alloc<std::pair<const_phmap::priv::NonStandardLayout,_int>_>_>
            ::end(&this->inner_->set_);
    local_30 = iVar2.ctrl_;
    (this->it_end_).ctrl_ = local_30;
    local_28 = iVar2.field_1;
    (this->it_end_).field_1 = local_28;
  }
  this->inner_ = (Inner *)0x0;
  return;
}

Assistant:

void skip_empty() {
            while (it_ == it_end_) {
                ++inner_;
                if (inner_ == inner_end_) {
                    inner_ = nullptr; // marks end()
                    break;
                }
                else {
                    it_ = inner_->set_.begin();
                    it_end_ = inner_->set_.end();
                }
            }
        }